

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_type.hxx
# Opt level: O2

string * __thiscall
nuraft::msg_type_to_string_abi_cxx11_(string *__return_storage_ptr__,nuraft *this,msg_type type)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  switch((int)this) {
  case 1:
    pcVar1 = "request_vote_request";
    break;
  case 2:
    pcVar1 = "request_vote_response";
    break;
  case 3:
    pcVar1 = "append_entries_request";
    break;
  case 4:
    pcVar1 = "append_entries_response";
    break;
  case 5:
    pcVar1 = "client_request";
    break;
  case 6:
    pcVar1 = "add_server_request";
    break;
  case 7:
    pcVar1 = "add_server_response";
    break;
  case 8:
    pcVar1 = "remove_server_request";
    break;
  case 9:
    pcVar1 = "remove_server_response";
    break;
  case 10:
    pcVar1 = "sync_log_request";
    break;
  case 0xb:
    pcVar1 = "sync_log_response";
    break;
  case 0xc:
    pcVar1 = "join_cluster_request";
    break;
  case 0xd:
    pcVar1 = "join_cluster_response";
    break;
  case 0xe:
    pcVar1 = "leave_cluster_request";
    break;
  case 0xf:
    pcVar1 = "leave_cluster_response";
    break;
  case 0x10:
    pcVar1 = "install_snapshot_request";
    break;
  case 0x11:
    pcVar1 = "install_snapshot_response";
    break;
  case 0x12:
    pcVar1 = "ping_request";
    break;
  case 0x13:
    pcVar1 = "ping_response";
    break;
  case 0x14:
    pcVar1 = "pre_vote_request";
    break;
  case 0x15:
    pcVar1 = "pre_vote_response";
    break;
  case 0x16:
    pcVar1 = "other_request";
    break;
  case 0x17:
    pcVar1 = "other_response";
    break;
  case 0x18:
    pcVar1 = "priority_change_request";
    break;
  case 0x19:
    pcVar1 = "priority_change_response";
    break;
  case 0x1a:
    pcVar1 = "reconnect_request";
    break;
  case 0x1b:
    pcVar1 = "reconnect_response";
    break;
  case 0x1c:
    pcVar1 = "custom_notification_request";
    break;
  case 0x1d:
    pcVar1 = "custom_notification_response";
    break;
  default:
    std::__cxx11::to_string(&local_30,(int)this);
    std::operator+(&local_50,"unknown (",&local_30);
    std::operator+(__return_storage_ptr__,&local_50,")");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ATTR_UNUSED msg_type_to_string(msg_type type) {
    switch (type) {
    case request_vote_request:          return "request_vote_request";
    case request_vote_response:         return "request_vote_response";
    case append_entries_request:        return "append_entries_request";
    case append_entries_response:       return "append_entries_response";
    case client_request:                return "client_request";
    case add_server_request:            return "add_server_request";
    case add_server_response:           return "add_server_response";
    case remove_server_request:         return "remove_server_request";
    case remove_server_response:        return "remove_server_response";
    case sync_log_request:              return "sync_log_request";
    case sync_log_response:             return "sync_log_response";
    case join_cluster_request:          return "join_cluster_request";
    case join_cluster_response:         return "join_cluster_response";
    case leave_cluster_request:         return "leave_cluster_request";
    case leave_cluster_response:        return "leave_cluster_response";
    case install_snapshot_request:      return "install_snapshot_request";
    case install_snapshot_response:     return "install_snapshot_response";
    case ping_request:                  return "ping_request";
    case ping_response:                 return "ping_response";
    case pre_vote_request:              return "pre_vote_request";
    case pre_vote_response:             return "pre_vote_response";
    case other_request:                 return "other_request";
    case other_response:                return "other_response";
    case priority_change_request:       return "priority_change_request";
    case priority_change_response:      return "priority_change_response";
    case reconnect_request:             return "reconnect_request";
    case reconnect_response:            return "reconnect_response";
    case custom_notification_request:   return "custom_notification_request";
    case custom_notification_response:  return "custom_notification_response";
    default:
        return "unknown (" + std::to_string(static_cast<int>(type)) + ")";
    }
}